

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

void __thiscall
Disa::Vector_Dense<double,_0UL>::Vector_Dense
          (Vector_Dense<double,_0UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  size_type sVar1;
  reference pvVar2;
  double dVar3;
  ulong local_40;
  size_type i_element;
  allocator<double> local_21;
  size_t local_20;
  size_t size_local;
  function<double_(unsigned_long)> *lambda_local;
  Vector_Dense<double,_0UL> *this_local;
  
  local_20 = size;
  size_local = (size_t)lambda;
  lambda_local = (function<double_(unsigned_long)> *)this;
  std::allocator<double>::allocator(&local_21);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->super_vector<double,_std::allocator<double>_>,size,&local_21);
  std::allocator<double>::~allocator(&local_21);
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      (&this->super_vector<double,_std::allocator<double>_>);
    if (sVar1 <= local_40) break;
    dVar3 = std::function<double_(unsigned_long)>::operator()
                      ((function<double_(unsigned_long)> *)size_local,local_40);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->super_vector<double,_std::allocator<double>_>,local_40);
    *pvVar2 = dVar3;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

explicit Vector_Dense(const std::function<_type(std::size_t)>& lambda, std::size_t size) : std::vector<_type>(size) {
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }